

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O1

Own<kj::_::ForkBranch<kj::_::Void>_> __thiscall
kj::heap<kj::_::ForkBranch<kj::_::Void>,kj::Own<kj::_::ForkHub<kj::_::Void>>>
          (kj *this,Own<kj::_::ForkHub<kj::_::Void>_> *params)

{
  ForkHubBase *pFVar1;
  ForkBranchBase *this_00;
  ForkBranch<kj::_::Void> *extraout_RDX;
  ForkBranch<kj::_::Void> *extraout_RDX_00;
  ForkBranch<kj::_::Void> *pFVar2;
  Own<kj::_::ForkBranch<kj::_::Void>_> OVar3;
  Own<kj::_::ForkHubBase> local_30;
  
  this_00 = (ForkBranchBase *)operator_new(0x30);
  local_30.disposer = params->disposer;
  local_30.ptr = &params->ptr->super_ForkHubBase;
  params->ptr = (ForkHub<kj::_::Void> *)0x0;
  _::ForkBranchBase::ForkBranchBase(this_00,&local_30);
  pFVar1 = local_30.ptr;
  (this_00->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_0045e068;
  *(undefined8 **)this = &_::HeapDisposer<kj::_::ForkBranch<kj::_::Void>>::instance;
  *(ForkBranchBase **)(this + 8) = this_00;
  pFVar2 = extraout_RDX;
  if ((ForkHub<kj::_::Void> *)local_30.ptr != (ForkHub<kj::_::Void> *)0x0) {
    local_30.ptr = (ForkHubBase *)0x0;
    (**(local_30.disposer)->_vptr_Disposer)
              (local_30.disposer,
               (((ForkHubBase *)&pFVar1->super_Refcounted)->super_Refcounted).super_Disposer.
               _vptr_Disposer[-2] +
               (long)&(((ForkHubBase *)&pFVar1->super_Refcounted)->super_Refcounted).super_Disposer.
                      _vptr_Disposer);
    pFVar2 = extraout_RDX_00;
  }
  OVar3.ptr = pFVar2;
  OVar3.disposer = (Disposer *)this;
  return OVar3;
}

Assistant:

Own<T> heap(Params&&... params) {
  // heap<T>(...) allocates a T on the heap, forwarding the parameters to its constructor.  The
  // exact heap implementation is unspecified -- for now it is operator new, but you should not
  // assume this.  (Since we know the object size at delete time, we could actually implement an
  // allocator that is more efficient than operator new.)

  return Own<T>(new T(kj::fwd<Params>(params)...), _::HeapDisposer<T>::instance);
}